

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O2

Vec_Ptr_t * Sim_ComputeStrSupp(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  void **ppvVar2;
  void *pvVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pAVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint nWords;
  ulong uVar11;
  
  uVar9 = pNtk->vCis->nSize;
  nWords = (((int)uVar9 >> 5) + 1) - (uint)((uVar9 & 0x1f) == 0);
  pVVar5 = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,nWords,1);
  for (uVar9 = 0; (int)uVar9 < pNtk->vCis->nSize; uVar9 = uVar9 + 1) {
    pAVar6 = Abc_NtkCi(pNtk,uVar9);
    puVar1 = (uint *)((long)pVVar5->pArray[pAVar6->Id] + (ulong)(uVar9 >> 5) * 4);
    *puVar1 = *puVar1 | 1 << ((byte)uVar9 & 0x1f);
  }
  uVar11 = (ulong)nWords;
  iVar10 = 0;
  if ((int)nWords < 1) {
    uVar11 = 0;
    iVar10 = 0;
  }
  for (; iVar10 < pNtk->vObjs->nSize; iVar10 = iVar10 + 1) {
    pvVar7 = Vec_PtrEntry(pNtk->vObjs,iVar10);
    if ((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7)) {
      ppvVar2 = pVVar5->pArray;
      pvVar3 = ppvVar2[*(int *)((long)pvVar7 + 0x10)];
      pvVar4 = ppvVar2[**(int **)((long)pvVar7 + 0x20)];
      pvVar7 = ppvVar2[(*(int **)((long)pvVar7 + 0x20))[1]];
      for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        *(uint *)((long)pvVar3 + uVar8 * 4) =
             *(uint *)((long)pvVar7 + uVar8 * 4) | *(uint *)((long)pvVar4 + uVar8 * 4);
      }
    }
  }
  for (iVar10 = 0; iVar10 < pNtk->vCos->nSize; iVar10 = iVar10 + 1) {
    pAVar6 = Abc_NtkCo(pNtk,iVar10);
    pvVar7 = pVVar5->pArray[pAVar6->Id];
    pvVar3 = pVVar5->pArray[*(pAVar6->vFanins).pArray];
    for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      *(undefined4 *)((long)pvVar7 + uVar8 * 4) = *(undefined4 *)((long)pvVar3 + uVar8 * 4);
    }
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Sim_ComputeStrSupp( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSuppStr;
    Abc_Obj_t * pNode;
    unsigned * pSimmNode, * pSimmNode1, * pSimmNode2;
    int nSuppWords, i, k;
    // allocate room for structural supports
    nSuppWords = SIM_NUM_WORDS( Abc_NtkCiNum(pNtk) );
    vSuppStr   = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nSuppWords, 1 );
    // assign the structural support to the PIs
    Abc_NtkForEachCi( pNtk, pNode, i )
        Sim_SuppStrSetVar( vSuppStr, pNode, i );
    // derive the structural supports of the internal nodes
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        pSimmNode  = (unsigned *)vSuppStr->pArray[ pNode->Id ];
        pSimmNode1 = (unsigned *)vSuppStr->pArray[ Abc_ObjFaninId0(pNode) ];
        pSimmNode2 = (unsigned *)vSuppStr->pArray[ Abc_ObjFaninId1(pNode) ];
        for ( k = 0; k < nSuppWords; k++ )
            pSimmNode[k] = pSimmNode1[k] | pSimmNode2[k];
    }
    // set the structural supports of the PO nodes
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pSimmNode  = (unsigned *)vSuppStr->pArray[ pNode->Id ];
        pSimmNode1 = (unsigned *)vSuppStr->pArray[ Abc_ObjFaninId0(pNode) ];
        for ( k = 0; k < nSuppWords; k++ )
            pSimmNode[k] = pSimmNode1[k];
    }
    return vSuppStr;
}